

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_signal.hpp
# Opt level: O0

int __thiscall
Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
::ConnectMember<SpeciesTracker>
          (Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *this,SpeciesTracker *inst,offset_in_SpeciesTracker_to_subr func)

{
  int iVar1;
  anon_class_24_2_3f47e9d7 local_70;
  function<void_(std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_58;
  offset_in_SpeciesTracker_to_subr local_38;
  offset_in_SpeciesTracker_to_subr func_local;
  SpeciesTracker *local_28;
  SpeciesTracker *inst_local;
  Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *this_local;
  
  local_70.inst = inst;
  local_70.func = func;
  local_38 = func;
  local_28 = inst;
  inst_local = (SpeciesTracker *)this;
  this_local = (Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)func;
  std::
  function<void(std::shared_ptr<PolymerWrapper>,std::__cxx11::string_const&,std::__cxx11::string_const&)>
  ::
  function<Signal<std::shared_ptr<PolymerWrapper>,std::__cxx11::string_const&,std::__cxx11::string_const&>::ConnectMember<SpeciesTracker>(SpeciesTracker*,void(SpeciesTracker::*)(std::shared_ptr<PolymerWrapper>,std::__cxx11::string_const&,std::__cxx11::string_const&))::_lambda(std::shared_ptr<PolymerWrapper>,std::__cxx11::string_const&,std::__cxx11::string_const&)_1_,void>
            ((function<void(std::shared_ptr<PolymerWrapper>,std::__cxx11::string_const&,std::__cxx11::string_const&)>
              *)&local_58,&local_70);
  iVar1 = Connect(this,&local_58);
  std::
  function<void_(std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_58);
  return iVar1;
}

Assistant:

int ConnectMember(T *inst, void (T::*func)(Args...)) {
    return Connect([=](Args... args) { (inst->*func)(args...); });
  }